

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFontGlyphRangesBuilder::AddText(ImFontGlyphRangesBuilder *this,char *text,char *text_end)

{
  uint uVar1;
  uint *in_RDX;
  uint *in_RSI;
  int c_len;
  uint c;
  ImWchar in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffe0;
  
  while( true ) {
    if (in_RDX == (uint *)0x0) {
      uVar1 = (uint)(char)*in_RSI;
    }
    else {
      uVar1 = (uint)(in_RSI < in_RDX);
    }
    if (uVar1 == 0) break;
    in_stack_ffffffffffffffe0 =
         ImTextCharFromUtf8(in_RSI,(char *)in_RDX,(char *)(ulong)in_stack_ffffffffffffffe0);
    in_RSI = (uint *)((long)in_RSI + (long)(int)in_stack_ffffffffffffffe0);
    if (in_stack_ffffffffffffffe0 == 0) {
      return;
    }
    AddChar((ImFontGlyphRangesBuilder *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
            in_stack_ffffffffffffffce);
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddText(const char* text, const char* text_end)
{
    while (text_end ? (text < text_end) : *text)
    {
        unsigned int c = 0;
        int c_len = ImTextCharFromUtf8(&c, text, text_end);
        text += c_len;
        if (c_len == 0)
            break;
        AddChar((ImWchar)c);
    }
}